

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

bool __thiscall QTextDocumentPrivate::unite(QTextDocumentPrivate *this,uint f)

{
  quint32 *pqVar1;
  FragmentMap *this_00;
  char16_t cVar2;
  quint32 qVar3;
  quint32 qVar4;
  uint uVar5;
  QTextFragmentData *pQVar6;
  char16_t *pcVar7;
  Header *pHVar8;
  uint z;
  int diff;
  QTextFragmentData *pQVar9;
  uint p;
  ulong uVar10;
  int iVar11;
  
  uVar10 = (ulong)f;
  this_00 = &this->fragments;
  z = QFragmentMapData<QTextFragmentData>::next(&this_00->data,f);
  if (z != 0) {
    pQVar6 = (this_00->data).field_0.fragments;
    if (pQVar6[z].format == pQVar6[uVar10].format) {
      pQVar9 = pQVar6 + uVar10;
      qVar3 = (pQVar9->super_QFragment<1>).size_array[0];
      if (qVar3 + pQVar9->stringPosition == pQVar6[z].stringPosition) {
        pcVar7 = (this->text).d.ptr;
        cVar2 = pcVar7[pQVar9->stringPosition];
        if ((ushort)cVar2 - 0xfdd0 < 2) {
          return false;
        }
        if (cVar2 == L'\x2029') {
          return false;
        }
        cVar2 = pcVar7[pQVar6[z].stringPosition];
        if ((ushort)cVar2 - 0xfdd0 < 2) {
          return false;
        }
        if (cVar2 == L'\x2029') {
          return false;
        }
        qVar4 = pQVar6[z].super_QFragment<1>.size_array[0];
        (pQVar9->super_QFragment<1>).size_array[0] = qVar3 + qVar4;
        while (uVar5 = (pQVar9->super_QFragment<1>).parent, uVar5 != 0) {
          pHVar8 = (this_00->data).field_0.head;
          pQVar9 = (QTextFragmentData *)((long)pHVar8 + (ulong)uVar5 * 0x20);
          iVar11 = (int)uVar10;
          uVar10 = (ulong)uVar5;
          if (*(int *)((long)pHVar8 + (ulong)uVar5 * 0x20 + 4) == iVar11) {
            pqVar1 = (pQVar9->super_QFragment<1>).size_left_array;
            *pqVar1 = *pqVar1 + qVar4;
          }
        }
        QFragmentMapData<QTextFragmentData>::erase_single(&this_00->data,z);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool QTextDocumentPrivate::unite(uint f)
{
    uint n = fragments.next(f);
    if (!n)
        return false;

    QTextFragmentData *ff = fragments.fragment(f);
    QTextFragmentData *nf = fragments.fragment(n);

    if (nf->format == ff->format && (ff->stringPosition + (int)ff->size_array[0] == nf->stringPosition)) {
        if (isValidBlockSeparator(text.at(ff->stringPosition))
            || isValidBlockSeparator(text.at(nf->stringPosition)))
            return false;

        fragments.setSize(f, ff->size_array[0] + nf->size_array[0]);
        fragments.erase_single(n);
        return true;
    }
    return false;
}